

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage_p.h
# Opt level: O0

int qt_depthForFormat(Format format)

{
  int depth;
  Format format_local;
  
  depth = 0;
  switch(format) {
  case Format_Invalid:
  case NImageFormats:
  case Format_Mono:
  case Format_MonoLSB:
    depth = 1;
    break;
  case Format_Indexed8:
  case Format_Alpha8:
  case Format_Grayscale8:
    depth = 8;
    break;
  case Format_RGB32:
  case Format_ARGB32:
  case Format_ARGB32_Premultiplied:
  case Format_RGBX8888:
  case Format_RGBA8888:
  case Format_RGBA8888_Premultiplied:
  case Format_BGR30:
  case Format_A2BGR30_Premultiplied:
  case Format_RGB30:
  case Format_A2RGB30_Premultiplied:
    depth = 0x20;
    break;
  case Format_RGB16:
  case Format_RGB555:
  case Format_RGB444:
  case Format_ARGB4444_Premultiplied:
  case Format_Grayscale16:
    depth = 0x10;
    break;
  case Format_ARGB8565_Premultiplied:
  case Format_RGB666:
  case Format_ARGB6666_Premultiplied:
  case Format_ARGB8555_Premultiplied:
  case Format_RGB888:
  case Format_BGR888:
    depth = 0x18;
    break;
  case Format_RGBX64:
  case Format_RGBA64:
  case Format_RGBA64_Premultiplied:
  case Format_RGBX16FPx4:
  case Format_RGBA16FPx4:
  case Format_RGBA16FPx4_Premultiplied:
    depth = 0x40;
    break;
  case Format_RGBX32FPx4:
  case Format_RGBA32FPx4:
  case Format_RGBA32FPx4_Premultiplied:
    depth = 0x80;
    break;
  case Format_CMYK8888:
    depth = 0x20;
  }
  return depth;
}

Assistant:

inline int qt_depthForFormat(QImage::Format format)
{
    int depth = 0;
    switch(format) {
    case QImage::Format_Invalid:
    case QImage::NImageFormats:
        Q_UNREACHABLE();
    case QImage::Format_Mono:
    case QImage::Format_MonoLSB:
        depth = 1;
        break;
    case QImage::Format_Indexed8:
    case QImage::Format_Alpha8:
    case QImage::Format_Grayscale8:
        depth = 8;
        break;
    case QImage::Format_RGB32:
    case QImage::Format_ARGB32:
    case QImage::Format_ARGB32_Premultiplied:
    case QImage::Format_RGBX8888:
    case QImage::Format_RGBA8888:
    case QImage::Format_RGBA8888_Premultiplied:
    case QImage::Format_BGR30:
    case QImage::Format_A2BGR30_Premultiplied:
    case QImage::Format_RGB30:
    case QImage::Format_A2RGB30_Premultiplied:
        depth = 32;
        break;
    case QImage::Format_RGB555:
    case QImage::Format_RGB16:
    case QImage::Format_RGB444:
    case QImage::Format_ARGB4444_Premultiplied:
    case QImage::Format_Grayscale16:
        depth = 16;
        break;
    case QImage::Format_RGB666:
    case QImage::Format_ARGB6666_Premultiplied:
    case QImage::Format_ARGB8565_Premultiplied:
    case QImage::Format_ARGB8555_Premultiplied:
    case QImage::Format_RGB888:
    case QImage::Format_BGR888:
        depth = 24;
        break;
    case QImage::Format_RGBX64:
    case QImage::Format_RGBA64:
    case QImage::Format_RGBA64_Premultiplied:
    case QImage::Format_RGBX16FPx4:
    case QImage::Format_RGBA16FPx4:
    case QImage::Format_RGBA16FPx4_Premultiplied:
        depth = 64;
        break;
    case QImage::Format_RGBX32FPx4:
    case QImage::Format_RGBA32FPx4:
    case QImage::Format_RGBA32FPx4_Premultiplied:
        depth = 128;
        break;
    case QImage::Format_CMYK8888:
        depth = 32;
        break;
    }
    return depth;
}